

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# downloader.h
# Opt level: O3

void __thiscall Downloader::Find(Downloader *this,string *package,bool downloadonly)

{
  pointer pcVar1;
  pointer ppVar2;
  pointer ppVar3;
  pointer pbVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  ostream *poVar8;
  long lVar9;
  undefined8 uVar10;
  _Alloc_hider _Var11;
  bool bVar12;
  pointer pbVar13;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pVar14;
  string compiler_original;
  vector<std::pair<int,_DownloadPackage>,_std::allocator<std::pair<int,_DownloadPackage>_>_> pkglist
  ;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> e;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  string cpackage;
  string compiler;
  DownloadPackage inpack;
  DownloadPackage outpack;
  undefined1 local_4b0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_498;
  _Alloc_hider local_488;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_478;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_468;
  _Alloc_hider local_438;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428;
  string local_418;
  vector<std::pair<int,_DownloadPackage>,_std::allocator<std::pair<int,_DownloadPackage>_>_>
  local_3f8;
  long *local_3e0 [2];
  long local_3d0 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3c0;
  string local_3a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_388;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_380;
  pointer local_378;
  string local_370;
  string local_350;
  long *local_330 [2];
  long local_320 [2];
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  undefined1 local_270 [64];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_230;
  _Alloc_hider local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0;
  undefined1 local_1e0 [112];
  _Alloc_hider local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  DownloadPackage local_150;
  DownloadPackage local_c0;
  
  getUrl_abi_cxx11_(&local_290,this);
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"tir","");
  GetPackageList(&local_3c0,this,&local_290,&local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  pbVar4 = local_3c0.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar13 = local_3c0.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (local_3c0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_3c0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar7 = (long)local_3c0.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_3c0.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5;
    lVar9 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar9 == 0; lVar9 = lVar9 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<std::__cxx11::string>>>
              (local_3c0.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_3c0.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar9 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<std::__cxx11::string>>>
              (pbVar13,pbVar4);
  }
  pcVar1 = (package->_M_dataplus)._M_p;
  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2d0,pcVar1,pcVar1 + package->_M_string_length);
  LibParse((DownloadPackage *)local_270,this,&local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
  pcVar1 = local_4b0 + 0x10;
  local_4b0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4b0,"win64","");
  pVar14 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::equal_range(&local_230,(key_type *)local_4b0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_aux(&local_230,(_Base_ptr)pVar14.first._M_node,(_Base_ptr)pVar14.second._M_node);
  if ((pointer)local_4b0._0_8_ != pcVar1) {
    operator_delete((void *)local_4b0._0_8_,local_4b0._16_8_ + 1);
  }
  local_4b0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4b0,"linux","");
  pVar14 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::equal_range(&local_230,(key_type *)local_4b0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_aux(&local_230,(_Base_ptr)pVar14.first._M_node,(_Base_ptr)pVar14.second._M_node);
  if ((pointer)local_4b0._0_8_ != pcVar1) {
    operator_delete((void *)local_4b0._0_8_,local_4b0._16_8_ + 1);
  }
  local_4b0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4b0,"msvc","");
  pVar14 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::equal_range(&local_230,(key_type *)local_4b0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_aux(&local_230,(_Base_ptr)pVar14.first._M_node,(_Base_ptr)pVar14.second._M_node);
  if ((pointer)local_4b0._0_8_ != pcVar1) {
    operator_delete((void *)local_4b0._0_8_,local_4b0._16_8_ + 1);
  }
  local_4b0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4b0,"gnuc","");
  pVar14 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::equal_range(&local_230,(key_type *)local_4b0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_aux(&local_230,(_Base_ptr)pVar14.first._M_node,(_Base_ptr)pVar14.second._M_node);
  if ((pointer)local_4b0._0_8_ != pcVar1) {
    operator_delete((void *)local_4b0._0_8_,local_4b0._16_8_ + 1);
  }
  local_4b0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4b0,"cling","");
  pVar14 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::equal_range(&local_230,(key_type *)local_4b0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_aux(&local_230,(_Base_ptr)pVar14.first._M_node,(_Base_ptr)pVar14.second._M_node);
  if ((pointer)local_4b0._0_8_ != pcVar1) {
    operator_delete((void *)local_4b0._0_8_,local_4b0._16_8_ + 1);
  }
  get_compiler_abi_cxx11_(&local_418,this,true);
  local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_310,local_418._M_dataplus._M_p,
             local_418._M_dataplus._M_p + local_418._M_string_length);
  get_compiler_for_download(&local_2f0,this,&local_310);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
  }
  iVar5 = std::__cxx11::string::compare((char *)&local_2f0);
  if (iVar5 == 0) {
    poVar8 = operator<<((ostream *)&std::cout,(_xout_color)(uchar)ispring::xout._52_4_);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"The specified compiler is not supported.",0x28);
    poVar8 = operator<<(poVar8,(_xout_color)SUB41(ispring::xout._52_4_,3));
    std::endl<char,std::char_traits<char>>(poVar8);
    exit(1);
  }
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_230,&local_2f0);
  local_4b0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4b0,"linux","");
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_230,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4b0);
  if ((pointer)local_4b0._0_8_ != pcVar1) {
    operator_delete((void *)local_4b0._0_8_,local_4b0._16_8_ + 1);
  }
  local_3f8.
  super__Vector_base<std::pair<int,_DownloadPackage>,_std::allocator<std::pair<int,_DownloadPackage>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pair<int,_DownloadPackage> *)0x0;
  local_3f8.
  super__Vector_base<std::pair<int,_DownloadPackage>,_std::allocator<std::pair<int,_DownloadPackage>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pair<int,_DownloadPackage> *)0x0;
  local_3f8.
  super__Vector_base<std::pair<int,_DownloadPackage>,_std::allocator<std::pair<int,_DownloadPackage>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_378 = local_3c0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (local_3c0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_3c0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_388 = &local_150.url.field_2;
    local_380 = &local_160;
    bVar12 = false;
    pbVar13 = local_3c0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_3e0[0] = local_3d0;
      pcVar1 = (pbVar13->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_3e0,pcVar1,pcVar1 + pbVar13->_M_string_length);
      std::__cxx11::string::find_last_of((char *)local_3e0,0x13c193,0xffffffffffffffff);
      std::__cxx11::string::substr((ulong)local_330,(ulong)local_3e0);
      std::__cxx11::string::rfind((char)local_330,0x2e);
      std::__cxx11::string::substr((ulong)&local_350,(ulong)local_330);
      CLibParse((DownloadPackage *)local_1e0,this,&local_350);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_350._M_dataplus._M_p != &local_350.field_2) {
        operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::_M_assign((string *)&local_170);
      iVar5 = DownloadPackage::match((DownloadPackage *)local_270,(DownloadPackage *)local_1e0);
      if (iVar5 == -1) {
        DownloadPackage::DownloadPackage(&local_150,(DownloadPackage *)local_1e0);
        local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3a8,local_418._M_dataplus._M_p,
                   local_418._M_dataplus._M_p + local_418._M_string_length);
        Download(this,&local_150,&local_3a8,downloadonly);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
          operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150.url._M_dataplus._M_p != local_388) {
          operator_delete(local_150.url._M_dataplus._M_p,
                          local_150.url.field_2._M_allocated_capacity + 1);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree(&local_150.options._M_t);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150.version._M_dataplus._M_p != &local_150.version.field_2) {
          operator_delete(local_150.version._M_dataplus._M_p,
                          local_150.version.field_2._M_allocated_capacity + 1);
        }
        bVar12 = true;
        uVar10 = local_150.libname.field_2._M_allocated_capacity;
        _Var11._M_p = local_150.libname._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150.libname._M_dataplus._M_p != &local_150.libname.field_2) {
LAB_0011ed40:
          operator_delete(_Var11._M_p,uVar10 + 1);
        }
      }
      else if (iVar5 != 0x7fffffff) {
        local_4b0._0_4_ = iVar5;
        DownloadPackage::DownloadPackage
                  ((DownloadPackage *)(local_4b0 + 8),(DownloadPackage *)local_1e0);
        std::vector<std::pair<int,DownloadPackage>,std::allocator<std::pair<int,DownloadPackage>>>::
        emplace_back<std::pair<int,DownloadPackage>>
                  ((vector<std::pair<int,DownloadPackage>,std::allocator<std::pair<int,DownloadPackage>>>
                    *)&local_3f8,(pair<int,_DownloadPackage> *)local_4b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438._M_p != &local_428) {
          operator_delete(local_438._M_p,local_428._M_allocated_capacity + 1);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree(&local_468);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_488._M_p != &local_478) {
          operator_delete(local_488._M_p,local_478._M_allocated_capacity + 1);
        }
        uVar10 = local_498._0_8_;
        _Var11._M_p = (pointer)local_4b0._8_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4b0._8_8_ != &local_498) goto LAB_0011ed40;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_p != local_380) {
        operator_delete(local_170._M_p,local_160._M_allocated_capacity + 1);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_1e0 + 0x40));
      if ((undefined1 *)local_1e0._32_8_ != local_1e0 + 0x30) {
        operator_delete((void *)local_1e0._32_8_,local_1e0._48_8_ + 1);
      }
      if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
        operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
      }
      if (local_330[0] != local_320) {
        operator_delete(local_330[0],local_320[0] + 1);
      }
      if (local_3e0[0] != local_3d0) {
        operator_delete(local_3e0[0],local_3d0[0] + 1);
      }
    } while ((iVar5 != -1) && (pbVar13 = pbVar13 + 1, pbVar13 != local_378));
    if (bVar12) goto LAB_0011f13f;
  }
  ppVar3 = local_3f8.
           super__Vector_base<std::pair<int,_DownloadPackage>,_std::allocator<std::pair<int,_DownloadPackage>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar2 = local_3f8.
           super__Vector_base<std::pair<int,_DownloadPackage>,_std::allocator<std::pair<int,_DownloadPackage>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_3f8.
      super__Vector_base<std::pair<int,_DownloadPackage>,_std::allocator<std::pair<int,_DownloadPackage>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_3f8.
      super__Vector_base<std::pair<int,_DownloadPackage>,_std::allocator<std::pair<int,_DownloadPackage>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    lVar9 = ((long)local_3f8.
                   super__Vector_base<std::pair<int,_DownloadPackage>,_std::allocator<std::pair<int,_DownloadPackage>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_3f8.
                   super__Vector_base<std::pair<int,_DownloadPackage>,_std::allocator<std::pair<int,_DownloadPackage>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x79435e50d79435e5;
    std::
    _Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<int,_DownloadPackage>_*,_std::vector<std::pair<int,_DownloadPackage>,_std::allocator<std::pair<int,_DownloadPackage>_>_>_>,_std::pair<int,_DownloadPackage>_>
    ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<int,_DownloadPackage>_*,_std::vector<std::pair<int,_DownloadPackage>,_std::allocator<std::pair<int,_DownloadPackage>_>_>_>,_std::pair<int,_DownloadPackage>_>
                         *)local_4b0,
                        (__normal_iterator<std::pair<int,_DownloadPackage>_*,_std::vector<std::pair<int,_DownloadPackage>,_std::allocator<std::pair<int,_DownloadPackage>_>_>_>
                         )local_3f8.
                          super__Vector_base<std::pair<int,_DownloadPackage>,_std::allocator<std::pair<int,_DownloadPackage>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                        (lVar9 - (lVar9 + 1 >> 0x3f)) + 1 >> 1);
    if (local_4b0._16_8_ == 0) {
      std::
      __inplace_stable_sort<__gnu_cxx::__normal_iterator<std::pair<int,DownloadPackage>*,std::vector<std::pair<int,DownloadPackage>,std::allocator<std::pair<int,DownloadPackage>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Downloader::Find(std::__cxx11::string,bool)::_lambda(std::pair<int,DownloadPackage>const&,std::pair<int,DownloadPackage>const&)_1_>>
                (ppVar2,ppVar3);
    }
    else {
      std::
      __stable_sort_adaptive<__gnu_cxx::__normal_iterator<std::pair<int,DownloadPackage>*,std::vector<std::pair<int,DownloadPackage>,std::allocator<std::pair<int,DownloadPackage>>>>,std::pair<int,DownloadPackage>*,long,__gnu_cxx::__ops::_Iter_comp_iter<Downloader::Find(std::__cxx11::string,bool)::_lambda(std::pair<int,DownloadPackage>const&,std::pair<int,DownloadPackage>const&)_1_>>
                (ppVar2,ppVar3,local_4b0._16_8_,local_4b0._8_8_);
    }
    std::
    _Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<int,_DownloadPackage>_*,_std::vector<std::pair<int,_DownloadPackage>,_std::allocator<std::pair<int,_DownloadPackage>_>_>_>,_std::pair<int,_DownloadPackage>_>
    ::~_Temporary_buffer
              ((_Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<int,_DownloadPackage>_*,_std::vector<std::pair<int,_DownloadPackage>,_std::allocator<std::pair<int,_DownloadPackage>_>_>_>,_std::pair<int,_DownloadPackage>_>
                *)local_4b0);
    DownloadPackage::DownloadPackage
              (&local_c0,
               &(local_3f8.
                 super__Vector_base<std::pair<int,_DownloadPackage>,_std::allocator<std::pair<int,_DownloadPackage>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->second);
    local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_370,local_418._M_dataplus._M_p,
               local_418._M_dataplus._M_p + local_418._M_string_length);
    Download(this,&local_c0,&local_370,downloadonly);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370._M_dataplus._M_p != &local_370.field_2) {
      operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0.url._M_dataplus._M_p != &local_c0.url.field_2) {
      operator_delete(local_c0.url._M_dataplus._M_p,local_c0.url.field_2._M_allocated_capacity + 1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_c0.options._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0.version._M_dataplus._M_p != &local_c0.version.field_2) {
      operator_delete(local_c0.version._M_dataplus._M_p,
                      local_c0.version.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0.libname._M_dataplus._M_p != &local_c0.libname.field_2) {
      operator_delete(local_c0.libname._M_dataplus._M_p,
                      local_c0.libname.field_2._M_allocated_capacity + 1);
    }
    goto LAB_0011f13f;
  }
  iVar5 = -0x37;
  if ((byte)((char)ispring::xout._52_4_ - 0x30U) < 10) {
    iVar6 = -0x30;
LAB_0011efdf:
    printf("%s",(&PTR_anon_var_dwarf_2a93_00150a10)[iVar6 + (ispring::xout._52_4_ & 0xff)]);
  }
  else {
    iVar6 = -0x37;
    if ((byte)((char)ispring::xout._52_4_ + 0xbfU) < 6) goto LAB_0011efdf;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"ERROR: Could not find a version that satisfies the requirement "
             ,0x3f);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_270._0_8_,local_270._8_8_);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"ERROR: No matching distribution found for ",0x2a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(char *)local_270._0_8_,local_270._8_8_);
  iVar6 = std::__cxx11::string::compare(local_270 + 0x20);
  if (iVar6 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"==",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,(char *)local_270._32_8_,local_270._40_8_);
  }
  if ((byte)(SUB41(ispring::xout._52_4_,3) - 0x30U) < 10) {
    iVar5 = -0x30;
LAB_0011f0f8:
    printf("%s",(&PTR_anon_var_dwarf_2a93_00150a10)[iVar5 + ((uint)ispring::xout._52_4_ >> 0x18)]);
  }
  else if ((byte)(SUB41(ispring::xout._52_4_,3) + 0xbfU) < 6) goto LAB_0011f0f8;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
LAB_0011f13f:
  std::vector<std::pair<int,_DownloadPackage>,_std::allocator<std::pair<int,_DownloadPackage>_>_>::
  ~vector(&local_3f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418._M_dataplus._M_p != &local_418.field_2) {
    operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_p != &local_1f0) {
    operator_delete(local_200._M_p,local_1f0._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_230);
  if ((undefined1 *)local_270._32_8_ != local_270 + 0x30) {
    operator_delete((void *)local_270._32_8_,local_270._48_8_ + 1);
  }
  if ((undefined1 *)local_270._0_8_ != local_270 + 0x10) {
    operator_delete((void *)local_270._0_8_,local_270._16_8_ + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3c0);
  return;
}

Assistant:

void Find(std::string package,bool downloadonly=false){
        auto list=GetPackageList(getUrl(), "tir");
        std::sort(list.begin(), list.end(), std::greater<std::string>());
        //1. 버전 없음   opencv
        //2. 버전 있음   opencv==3.4
        //3. 옵션 있음   opencv==3.4+cu100
        DownloadPackage inpack=LibParse(package);
        inpack.options.erase("win64");
        inpack.options.erase("linux");
        inpack.options.erase("msvc");
        inpack.options.erase("gnuc");
        inpack.options.erase("cling");
        std::string compiler_original=get_compiler();
        std::string compiler = get_compiler_for_download(compiler_original);
        if(compiler==""){
            std::cout << ispring::xout.red << "The specified compiler is not supported." << ispring::xout.white << std::endl;
            exit(1);
        }
        inpack.options.insert(compiler);
#if defined(_WIN32) || defined(_WIN64)
        inpack.options.insert("win64");
#elif defined(__linux__)
        inpack.options.insert("linux");
#endif
        bool match=false;
        std::vector<std::pair<int,DownloadPackage>> pkglist;
        for(auto e:list){
            int slash=e.find_last_of("/");
            std::string cpackage=e.substr(slash+1,e.length()-slash);
            DownloadPackage outpack=CLibParse(cpackage.substr(0,cpackage.find_last_of('.')));
            outpack.url=e;
            int diff=inpack.match(outpack);
            if(diff==-1) {
                match=true;
                Download(outpack,compiler_original,downloadonly);
                break;
            }else if(diff!=INT_MAX){
                pkglist.push_back(std::make_pair(diff,outpack));
            }
        }
        if(match==false && pkglist.empty()==false) {
            std::stable_sort(pkglist.begin(),pkglist.end(),[](const std::pair<int,DownloadPackage>& a,const std::pair<int,DownloadPackage>& b)->bool{
                return a.first < b.first;
            });
            match=true;
            Download(pkglist.front().second,compiler_original,downloadonly);
        }
        if(match==false){
            std::cout << ispring::xout.red << "ERROR: Could not find a version that satisfies the requirement " << inpack.libname << std::endl;
            std::cout << "ERROR: No matching distribution found for " << inpack.libname;
            if(inpack.version!="")
                std::cout << "==" << inpack.version ;
            std::cout << ispring::xout.white << std::endl;
        }
    }